

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t NodeHibernate(anynode *AnyNode)

{
  nodecontext *p_00;
  int iVar1;
  bool_t bVar2;
  char *pcStack_30;
  int v;
  memcollectitem *i;
  int NextLevel;
  int Level;
  bool_t Changed;
  nodecontext *p;
  anynode *AnyNode_local;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xb2b,"bool_t NodeHibernate(anynode *)");
  }
  p_00 = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  _NextLevel = 0;
  if (p_00->InCollect == 0) {
    p_00->InCollect = 1;
    i._4_4_ = 0;
    while (_NextLevel == 0) {
      i._0_4_ = 0x7fffffff;
      if (p_00 == (nodecontext *)0xffffffffffffff30) {
        __assert_fail("&(p->Collect)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0xb38,"bool_t NodeHibernate(anynode *)");
      }
      pcStack_30 = (p_00->Collect)._Begin;
      while( true ) {
        if (p_00 == (nodecontext *)0xffffffffffffff30) {
          __assert_fail("&(p->Collect)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0xb38,"bool_t NodeHibernate(anynode *)");
        }
        if (pcStack_30 == (p_00->Collect)._Begin + ((p_00->Collect)._Used & 0xfffffffffffffff0))
        break;
        iVar1 = (**(code **)pcStack_30)(*(undefined8 *)(pcStack_30 + 8),i._4_4_);
        if (iVar1 == -1) {
          _NextLevel = 1;
        }
        else if ((iVar1 < (int)i) && (i._4_4_ < iVar1)) {
          i._0_4_ = iVar1;
        }
        pcStack_30 = pcStack_30 + 0x10;
      }
      if ((int)i == 0x7fffffff) break;
      i._4_4_ = (int)i;
    }
    if ((_NextLevel == 0) && (bVar2 = NodeContext_Cleanup(p_00,0), bVar2 != 0)) {
      _NextLevel = 1;
    }
    p_00->InCollect = 0;
  }
  return _NextLevel;
}

Assistant:

bool_t NodeHibernate(anynode* AnyNode)
{
    nodecontext* p = Node_Context(AnyNode);
    bool_t Changed = 0;

    if (!p->InCollect)
    {
        int Level;
        int NextLevel;
        memcollectitem* i;
        p->InCollect = 1;

        for (Level=COLLECT_UNUSED;!Changed;Level=NextLevel)
        {
            NextLevel = INT_MAX;
            for (i=ARRAYBEGIN(p->Collect,memcollectitem);i!=ARRAYEND(p->Collect,memcollectitem);++i)
            {
                int v=i->Func(i->Cookie,Level);
                if (v==COLLECT_FOUND)
                    Changed=1;
                else
                if (NextLevel>v && v>Level)
                    NextLevel=v;
            }
            if (NextLevel==INT_MAX)
                break;
        }

        if (!Changed && NodeContext_Cleanup(p,0))
            Changed = 1;

        p->InCollect = 0;
    }

    return Changed;
}